

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::RedirectedStream::RedirectedStream
          (RedirectedStream *this,ostream *originalStream,ostream *redirectionStream)

{
  ostream *poVar1;
  long lVar2;
  streambuf *psVar3;
  ostream *redirectionStream_local;
  ostream *originalStream_local;
  RedirectedStream *this_local;
  
  this->m_originalStream = originalStream;
  this->m_redirectionStream = redirectionStream;
  psVar3 = (streambuf *)std::ios::rdbuf();
  this->m_prevBuf = psVar3;
  poVar1 = this->m_originalStream;
  lVar2 = *(long *)(*(long *)poVar1 + -0x18);
  std::ios::rdbuf();
  std::ios::rdbuf((streambuf *)(poVar1 + lVar2));
  return;
}

Assistant:

RedirectedStream::RedirectedStream( std::ostream& originalStream, std::ostream& redirectionStream )
    :   m_originalStream( originalStream ),
        m_redirectionStream( redirectionStream ),
        m_prevBuf( m_originalStream.rdbuf() )
    {
        m_originalStream.rdbuf( m_redirectionStream.rdbuf() );
    }